

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

void __thiscall tinyusdz::usdc::USDCReader::Impl::~Impl(Impl *this)

{
  CrateReader *this_00;
  Impl *this_local;
  
  this_00 = this->crate_reader;
  if (this_00 != (CrateReader *)0x0) {
    crate::CrateReader::~CrateReader(this_00);
    operator_delete(this_00,0x270);
  }
  this->crate_reader = (CrateReader *)0x0;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->_supported_prim_attr_types);
  ::std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->_prim_table);
  ::std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map(&this->_variantPropChildren);
  ::std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map(&this->_variantPrimChildren);
  ::std::
  map<int,_tinyusdz::Variant,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Variant>_>_>
  ::~map(&this->_variants);
  ::std::
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  ::~map(&this->_variantProps);
  ::std::
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  ::~map(&this->_variantPrimSpecs);
  ::std::
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>::
  ~map(&this->_variantPrims);
  ::std::
  map<unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
  ::~map(&this->_variantChildren);
  ::std::
  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::~map(&this->_live_fieldsets);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_elemPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::~vector
            (&this->_string_indices);
  ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::~vector
            (&this->_fieldset_indices);
  ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::~vector
            (&this->_fields);
  ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::~vector
            (&this->_specs);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  ~vector(&this->_nodes);
  ::std::__cxx11::string::~string((string *)&this->_warn);
  ::std::__cxx11::string::~string((string *)&this->_err);
  return;
}

Assistant:

~Impl() {
    delete crate_reader;
    crate_reader = nullptr;
  }